

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O1

void __thiscall
ArenaVectorBase<ArenaVector<wasm::Name>,wasm::Name>::
set<std::vector<wasm::Name,std::allocator<wasm::Name>>>
          (ArenaVectorBase<ArenaVector<wasm::Name>,wasm::Name> *this,
          vector<wasm::Name,_std::allocator<wasm::Name>_> *list)

{
  undefined8 *puVar1;
  pointer pNVar2;
  pointer pNVar3;
  long lVar4;
  undefined8 uVar5;
  void *pvVar6;
  long lVar7;
  size_t size;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *__range2;
  ulong uVar8;
  
  size = (long)(list->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(list->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
               super__Vector_impl_data._M_start;
  uVar8 = (long)size >> 4;
  if (*(ulong *)(this + 0x10) < uVar8) {
    *(ulong *)(this + 0x10) = uVar8;
    pvVar6 = MixedArena::allocSpace(*(MixedArena **)(this + 0x18),size,8);
    *(void **)this = pvVar6;
  }
  pNVar2 = (list->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pNVar3 = (list->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pNVar2 != pNVar3) {
    lVar7 = 0;
    do {
      lVar4 = *(long *)this;
      puVar1 = (undefined8 *)((long)&(pNVar2->super_IString).str._M_len + lVar7);
      uVar5 = puVar1[1];
      *(undefined8 *)(lVar4 + lVar7) = *puVar1;
      ((undefined8 *)(lVar4 + lVar7))[1] = uVar5;
      lVar7 = lVar7 + 0x10;
    } while ((pointer)(puVar1 + 2) != pNVar3);
  }
  *(ulong *)(this + 8) = uVar8;
  return;
}

Assistant:

void set(const ListType& list) {
    size_t size = list.size();
    if (allocatedElements < size) {
      static_cast<SubType*>(this)->allocate(size);
    }
    size_t i = 0;
    for (auto elem : list) {
      data[i++] = elem;
    }
    usedElements = size;
  }